

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  int iVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  S2LogMessage local_18;
  
  if (r2 < (longdouble)2.0) {
    lVar7 = *(longdouble *)(x->c_ + 1);
    lVar6 = *(longdouble *)(x->c_ + 2);
    lVar8 = *(longdouble *)(y->c_ + 1);
    lVar1 = *(longdouble *)(y->c_ + 2);
    lVar5 = (lVar7 - lVar8) * (lVar1 + lVar6) - (lVar7 + lVar8) * (lVar6 - lVar1);
    lVar2 = *(longdouble *)x->c_;
    lVar3 = *(longdouble *)y->c_;
    lVar10 = (lVar6 - lVar1) * (lVar2 + lVar3) - (lVar1 + lVar6) * (lVar2 - lVar3);
    lVar9 = (lVar2 - lVar3) * (lVar7 + lVar8) - (lVar7 - lVar8) * (lVar2 + lVar3);
    lVar6 = ((longdouble)0.25 * (lVar9 * lVar9 + lVar10 * lVar10 + lVar5 * lVar5)) /
            ((lVar1 * lVar1 + lVar8 * lVar8 + lVar3 * lVar3) *
            (lVar6 * lVar6 + lVar7 * lVar7 + lVar2 * lVar2));
    sqrtl();
    lVar7 = ((longdouble)1 - (longdouble)0.25 * r2) * r2;
    lVar8 = lVar7 * (longdouble)1.6263033e-19 +
            lVar6 * (longdouble)1.0803100617998676e-18 + in_ST0 * (longdouble)3.3358085154969946e-34
            + (longdouble)2.781904613015566e-68;
    lVar6 = lVar6 - lVar7;
    iVar4 = 1;
    if (lVar6 <= lVar8) {
      iVar4 = -(uint)(lVar6 < -lVar8);
    }
    return iVar4;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
             ,0x1e8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_18.stream_,"Check failed: (r2) < (2.0) ",0x1b);
  abort();
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}